

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O0

void breakpoint_handler_x86_64(CPUState *cs)

{
  _Bool _Var1;
  CPUX86State *env_00;
  CPUBreakpoint *local_28;
  CPUBreakpoint *bp;
  CPUX86State *env;
  X86CPU *cpu;
  CPUState *cs_local;
  
  env_00 = (CPUX86State *)(cs[1].tb_jmp_cache + 0xeb);
  if (cs->watchpoint_hit == (CPUWatchpoint *)0x0) {
    for (local_28 = (cs->breakpoints).tqh_first; local_28 != (CPUBreakpoint *)0x0;
        local_28 = (local_28->entry).tqe_next) {
      if ((TranslationBlock *)local_28->pc == cs[1].tb_jmp_cache[0xfb]) {
        if ((local_28->flags & 0x20U) == 0) {
          return;
        }
        check_hw_breakpoints(env_00,true);
        raise_exception_x86_64(env_00,1);
      }
    }
  }
  else if ((cs->watchpoint_hit->flags & 0x20U) != 0) {
    cs->watchpoint_hit = (CPUWatchpoint *)0x0;
    _Var1 = check_hw_breakpoints(env_00,false);
    if (!_Var1) {
      cpu_loop_exit_noexc_x86_64(cs);
    }
    raise_exception_x86_64(env_00,1);
  }
  return;
}

Assistant:

void breakpoint_handler(CPUState *cs)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    CPUBreakpoint *bp;

    if (cs->watchpoint_hit) {
        if (cs->watchpoint_hit->flags & BP_CPU) {
            cs->watchpoint_hit = NULL;
            if (check_hw_breakpoints(env, false)) {
                raise_exception(env, EXCP01_DB);
            } else {
                cpu_loop_exit_noexc(cs);
            }
        }
    } else {
        QTAILQ_FOREACH(bp, &cs->breakpoints, entry) {
            if (bp->pc == env->eip) {
                if (bp->flags & BP_CPU) {
                    check_hw_breakpoints(env, true);
                    raise_exception(env, EXCP01_DB);
                }
                break;
            }
        }
    }
}